

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall xLearn::MetricTest_Create_Metric_Test::TestBody(MetricTest_Create_Metric_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined8 in_stack_fffffffffffffcc8;
  undefined1 success;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  AssertionResult local_268;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  AssertionResult local_228;
  string local_218;
  AssertHelper local_1f8;
  Message local_1f0;
  AssertionResult local_1e8;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0;
  AssertionResult local_1a8;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  AssertionResult local_168;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  AssertionResult local_a8;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  AssertionResult local_68;
  string local_58;
  AssertHelper local_38;
  Message local_30 [3];
  AssertionResult local_18;
  
  success = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
  CreateMetric((char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_18,(AssertionResult *)"CreateMetric(\"acc\") != NULL",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    testing::Message::~Message((Message *)0x180433);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1804ab);
  CreateMetric((char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_68,(AssertionResult *)"CreateMetric(\"prec\") != NULL",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x1805d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180649);
  CreateMetric((char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_a8,(AssertionResult *)"CreateMetric(\"recall\") != NULL"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x120,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message((Message *)0x180763);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1807db);
  CreateMetric((char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&local_e8,(AssertionResult *)"CreateMetric(\"f1\") != NULL",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x121,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message((Message *)0x1808f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18096d);
  CreateMetric((char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)&local_128,(AssertionResult *)"CreateMetric(\"auc\") != NULL",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x122,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    testing::Message::~Message((Message *)0x180a87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180aff);
  CreateMetric((char *)CONCAT17(uVar2,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_168,(AssertionResult *)"CreateMetric(\"mae\") != NULL",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x123,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message((Message *)0x180c19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180c91);
  CreateMetric((char *)CONCAT17(uVar2,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&local_1a8,(AssertionResult *)"CreateMetric(\"mape\") != NULL"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::Message::~Message((Message *)0x180dab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180e23);
  CreateMetric((char *)CONCAT17(uVar2,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_218,(internal *)&local_1e8,(AssertionResult *)"CreateMetric(\"rmsd\") != NULL"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x125,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    testing::Message::~Message((Message *)0x180f3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180fb5);
  CreateMetric((char *)CONCAT17(uVar2,in_stack_fffffffffffffd20));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)&local_228,(AssertionResult *)"CreateMetric(\"\") == NULL",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message((Message *)0x1810cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181147);
  CreateMetric((char *)CONCAT17(uVar2,in_stack_fffffffffffffd20));
  this_00 = &local_268;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_298,(internal *)&local_268,
               (AssertionResult *)"CreateMetric(\"unknow_name\") == NULL","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x127,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    testing::Message::~Message((Message *)0x18125f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1812d7);
  return;
}

Assistant:

TEST(MetricTest, Create_Metric) {
  EXPECT_TRUE(CreateMetric("acc") != NULL);
  EXPECT_TRUE(CreateMetric("prec") != NULL);
  EXPECT_TRUE(CreateMetric("recall") != NULL);
  EXPECT_TRUE(CreateMetric("f1") != NULL);
  EXPECT_TRUE(CreateMetric("auc") != NULL);
  EXPECT_TRUE(CreateMetric("mae") != NULL);
  EXPECT_TRUE(CreateMetric("mape") != NULL);
  EXPECT_TRUE(CreateMetric("rmsd") != NULL);
  EXPECT_TRUE(CreateMetric("") == NULL);
  EXPECT_TRUE(CreateMetric("unknow_name") == NULL);
}